

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpreadwrite.c
# Opt level: O3

int http_MakeMessage(membuffer *buf,int http_major_version,int http_minor_version,char *fmt,...)

{
  byte bVar1;
  UpnpListHead *list;
  char in_AL;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  http_method_t *phVar6;
  undefined8 *puVar7;
  int *piVar8;
  tm *ptVar9;
  size_t sVar10;
  size_t *psVar11;
  uint *puVar12;
  UpnpExtraHeaders *p;
  UpnpExtraHeaders *pUVar13;
  size_t buf_len;
  long *plVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  time_t *__timer;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 uVar19;
  char *pcVar20;
  char *pcVar21;
  char *pcVar22;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list argp;
  time_t curr_time;
  char tempbuf [200];
  uri_type url;
  tm date_storage;
  http_method_t local_e8 [2];
  undefined8 auStack_e0 [4];
  undefined8 local_c0;
  undefined4 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Da;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  auStack_e0[3] = in_R8;
  local_c0 = in_R9;
  memset(tempbuf,0,200);
  uVar15 = 0x20;
  argp[0].overflow_arg_area = &stack0x00000008;
LAB_0010ed34:
  bVar1 = *fmt;
  if (0x33 < bVar1 - 0x41) {
    if (bVar1 == 0) {
      return 0;
    }
switchD_0010ed50_caseD_46:
    __assert_fail("0",".upnp/src/genlib/net/http/httpreadwrite.c",0x7ca,
                  "int http_MakeMessage(membuffer *, int, int, const char *, ...)");
  }
  fmt = (char *)((byte *)fmt + 1);
  switch((uint)bVar1) {
  case 0x41:
    uVar16 = (ulong)uVar15;
    if (uVar16 < 0x29) {
      uVar15 = uVar15 + 8;
      plVar14 = (long *)((long)local_e8 + uVar16);
    }
    else {
      plVar14 = (long *)argp[0].overflow_arg_area;
      argp[0].overflow_arg_area = (void *)((long)argp[0].overflow_arg_area + 8);
    }
    if (*plVar14 == 0) {
      __assert_fail("RespInstr",".upnp/src/genlib/net/http/httpreadwrite.c",0x6d2,
                    "int http_MakeMessage(membuffer *, int, int, const char *, ...)");
    }
    pcVar20 = *(char **)(*plVar14 + 0x1b8);
    if ((pcVar20 != (char *)0x0) && (*pcVar20 != '\0')) {
      pcVar22 = "ssc";
      pcVar21 = "Access-Control-Allow-Origin: ";
      goto LAB_0010f57c;
    }
    goto LAB_0010ed34;
  case 0x42:
    uVar16 = (ulong)uVar15;
    if (uVar16 < 0x29) {
      uVar15 = uVar15 + 8;
      puVar12 = (uint *)((long)local_e8 + uVar16);
    }
    else {
      puVar12 = (uint *)argp[0].overflow_arg_area;
      argp[0].overflow_arg_area = (void *)((long)argp[0].overflow_arg_area + 8);
    }
    uVar3 = *puVar12;
    pcVar20 = http_get_code_text(uVar3);
    uVar3 = snprintf(tempbuf,200,"%s%d %s%s","<html><body><h1>",(ulong)uVar3,pcVar20,
                     "</h1></body></html>");
    iVar5 = -0x68;
    if (199 < uVar3) goto LAB_0010f6d2;
    sVar10 = strlen(tempbuf);
    iVar4 = http_MakeMessage(buf,http_major_version,http_minor_version,"NTcs",sVar10,"text/html",
                             tempbuf);
    goto joined_r0x0010f3da;
  case 0x43:
    if (http_minor_version == 1 && http_major_version == 1 || 1 < http_major_version) {
      pcVar20 = "CONNECTION: close\r\n";
      goto LAB_0010efb2;
    }
    goto LAB_0010ed34;
  case 0x44:
    curr_time = time((time_t *)0x0);
    __timer = &curr_time;
    pcVar22 = "DATE: ";
    pcVar20 = "\r\n";
    goto LAB_0010f31b;
  case 0x45:
    uVar16 = (ulong)uVar15;
    if (uVar16 < 0x29) {
      uVar15 = uVar15 + 8;
      puVar7 = (undefined8 *)((long)local_e8 + uVar16);
    }
    else {
      puVar7 = (undefined8 *)argp[0].overflow_arg_area;
      argp[0].overflow_arg_area = (void *)((long)argp[0].overflow_arg_area + 8);
    }
    list = (UpnpListHead *)*puVar7;
    if (list != (UpnpListHead *)0x0) {
      for (p = (UpnpExtraHeaders *)UpnpListBegin(list);
          pUVar13 = (UpnpExtraHeaders *)UpnpListEnd(list), p != pUVar13;
          p = (UpnpExtraHeaders *)UpnpListNext(list,&p->m_node)) {
        pcVar20 = UpnpExtraHeaders_get_resp(p);
        if (pcVar20 != (char *)0x0) {
          sVar10 = strlen(pcVar20);
          iVar4 = membuffer_append(buf,pcVar20,sVar10);
          iVar5 = -0x68;
          if ((iVar4 != 0) || (iVar4 = membuffer_append(buf,"\r\n",2), iVar4 != 0))
          goto LAB_0010f6d2;
        }
      }
    }
    goto LAB_0010ed34;
  default:
    goto switchD_0010ed50_caseD_46;
  case 0x47:
    uVar16 = (ulong)uVar15;
    if (uVar16 < 0x29) {
      uVar15 = uVar15 + 8;
      plVar14 = (long *)((long)local_e8 + uVar16);
    }
    else {
      plVar14 = (long *)argp[0].overflow_arg_area;
      argp[0].overflow_arg_area = (void *)((long)argp[0].overflow_arg_area + 8);
    }
    if (*plVar14 == 0) {
      __assert_fail("RespInstr",".upnp/src/genlib/net/http/httpreadwrite.c",0x6e1,
                    "int http_MakeMessage(membuffer *, int, int, const char *, ...)");
    }
    pcVar20 = (char *)(*plVar14 + 0x10);
    goto LAB_0010f655;
  case 0x4b:
    pcVar20 = "TRANSFER-ENCODING: chunked\r\n";
LAB_0010efb2:
    iVar5 = membuffer_append_str(buf,pcVar20);
    break;
  case 0x4c:
    goto switchD_0010ed50_caseD_4c;
  case 0x4e:
    uVar16 = (ulong)uVar15;
    if (uVar16 < 0x29) {
      uVar15 = uVar15 + 8;
      plVar14 = (long *)((long)local_e8 + uVar16);
    }
    else {
      plVar14 = (long *)argp[0].overflow_arg_area;
      argp[0].overflow_arg_area = (void *)((long)argp[0].overflow_arg_area + 8);
    }
    if (*plVar14 < 0) {
      __assert_fail("bignum >= 0",".upnp/src/genlib/net/http/httpreadwrite.c",0x747,
                    "int http_MakeMessage(membuffer *, int, int, const char *, ...)");
    }
    iVar4 = http_MakeMessage(buf,http_major_version,http_minor_version,"shc","CONTENT-LENGTH: ");
    iVar5 = -0x68;
    if (iVar4 != 0) goto LAB_0010f6d2;
    iVar4 = http_MakeMessage(buf,http_major_version,http_minor_version,"sc","Accept-Ranges: bytes");
    goto joined_r0x0010f3da;
  case 0x51:
    uVar16 = (ulong)uVar15;
    if (uVar16 < 0x29) {
      uVar15 = uVar15 + 8;
      phVar6 = (http_method_t *)((long)local_e8 + uVar16);
    }
    else {
      phVar6 = (http_method_t *)argp[0].overflow_arg_area;
      argp[0].overflow_arg_area = (void *)((long)argp[0].overflow_arg_area + 8);
    }
    pcVar20 = method_to_str(*phVar6);
    uVar16 = (ulong)uVar15;
    if (uVar16 < 0x29) {
      uVar19 = *(undefined8 *)((long)local_e8 + uVar16);
      uVar3 = uVar15 + 8;
      if (0x20 < uVar15) goto LAB_0010f0be;
      uVar3 = uVar15 + 0x10;
      puVar7 = (undefined8 *)((long)auStack_e0 + uVar16);
    }
    else {
      uVar19 = *argp[0].overflow_arg_area;
      argp[0].overflow_arg_area = (void *)((long)argp[0].overflow_arg_area + 8);
      uVar3 = uVar15;
LAB_0010f0be:
      puVar7 = (undefined8 *)argp[0].overflow_arg_area;
      argp[0].overflow_arg_area = (void *)((long)argp[0].overflow_arg_area + 8);
    }
    iVar5 = http_MakeMessage(buf,http_major_version,http_minor_version,"ssbsdsdc",pcVar20," ",uVar19
                             ,*puVar7," HTTP/",(ulong)(uint)http_major_version,".",
                             (ulong)(uint)http_minor_version);
    uVar15 = uVar3;
    break;
  case 0x52:
    uVar16 = (ulong)uVar15;
    if (uVar16 < 0x29) {
      uVar15 = uVar15 + 8;
      puVar12 = (uint *)((long)local_e8 + uVar16);
    }
    else {
      puVar12 = (uint *)argp[0].overflow_arg_area;
      argp[0].overflow_arg_area = (void *)((long)argp[0].overflow_arg_area + 8);
    }
    uVar3 = *puVar12;
    if ((int)uVar3 < 1) {
      __assert_fail("status_code > 0",".upnp/src/genlib/net/http/httpreadwrite.c",0x76d,
                    "int http_MakeMessage(membuffer *, int, int, const char *, ...)");
    }
    uVar2 = snprintf(tempbuf,200,"HTTP/%d.%d %d ",(ulong)(uint)http_major_version,
                     (ulong)(uint)http_minor_version,(ulong)uVar3);
    pcVar20 = http_get_code_text(uVar3);
    iVar5 = -0x68;
    if (199 < uVar2) goto LAB_0010f6d2;
    iVar4 = http_MakeMessage(buf,http_major_version,http_minor_version,"ssc",tempbuf,pcVar20);
    goto joined_r0x0010f3da;
  case 0x53:
  case 0x55:
    pcVar21 = "USER-AGENT: ";
    if (bVar1 == 0x53) {
      pcVar21 = "SERVER: ";
    }
    pcVar20 = tempbuf;
    get_sdk_info(pcVar20,200);
    pcVar22 = "ss";
    goto LAB_0010f57c;
  case 0x54:
    uVar16 = (ulong)uVar15;
    if (uVar16 < 0x29) {
      uVar15 = uVar15 + 8;
      puVar7 = (undefined8 *)((long)local_e8 + uVar16);
    }
    else {
      puVar7 = (undefined8 *)argp[0].overflow_arg_area;
      argp[0].overflow_arg_area = (void *)((long)argp[0].overflow_arg_area + 8);
    }
    pcVar20 = (char *)*puVar7;
    pcVar22 = "ssc";
    pcVar21 = "CONTENT-TYPE: ";
LAB_0010f57c:
    iVar5 = http_MakeMessage(buf,http_major_version,http_minor_version,pcVar22,pcVar21,pcVar20);
    break;
  case 0x58:
    uVar16 = (ulong)uVar15;
    if (uVar16 < 0x29) {
      uVar15 = uVar15 + 8;
      plVar14 = (long *)((long)local_e8 + uVar16);
    }
    else {
      plVar14 = (long *)argp[0].overflow_arg_area;
      argp[0].overflow_arg_area = (void *)((long)argp[0].overflow_arg_area + 8);
    }
    pcVar22 = (char *)*plVar14;
    if (pcVar22 == (char *)0x0) {
      __assert_fail("s",".upnp/src/genlib/net/http/httpreadwrite.c",0x764,
                    "int http_MakeMessage(membuffer *, int, int, const char *, ...)");
    }
    iVar4 = membuffer_append_str(buf,"X-User-Agent: ");
    iVar5 = -0x68;
    if (iVar4 != 0) goto LAB_0010f6d2;
    goto LAB_0010f6ad;
  case 0x62:
    uVar16 = (ulong)uVar15;
    if (uVar16 < 0x29) {
      uVar15 = uVar15 + 8;
      puVar7 = (undefined8 *)((long)local_e8 + uVar16);
    }
    else {
      puVar7 = (undefined8 *)argp[0].overflow_arg_area;
      argp[0].overflow_arg_area = (void *)((long)argp[0].overflow_arg_area + 8);
    }
    pcVar20 = (char *)*puVar7;
    UpnpPrintf(UPNP_ALL,HTTP,".upnp/src/genlib/net/http/httpreadwrite.c",0x6ed,
               "Adding a char Buffer starting with: %c\n",(ulong)(uint)(int)*pcVar20);
    uVar16 = (ulong)uVar15;
    if (uVar16 < 0x29) {
      uVar15 = uVar15 + 8;
      psVar11 = (size_t *)((long)local_e8 + uVar16);
    }
    else {
      psVar11 = (size_t *)argp[0].overflow_arg_area;
      argp[0].overflow_arg_area = (void *)((long)argp[0].overflow_arg_area + 8);
    }
    buf_len = *psVar11;
    goto LAB_0010f666;
  case 99:
    buf_len = 2;
    pcVar20 = "\r\n";
    goto LAB_0010f666;
  case 100:
    uVar16 = (ulong)uVar15;
    if (uVar16 < 0x29) {
      uVar15 = uVar15 + 8;
      piVar8 = (int *)((long)local_e8 + uVar16);
    }
    else {
      piVar8 = (int *)argp[0].overflow_arg_area;
      argp[0].overflow_arg_area = (void *)((long)argp[0].overflow_arg_area + 8);
    }
    lVar17 = (long)*piVar8;
    pcVar20 = "%zu";
    goto LAB_0010f69a;
  case 0x68:
    uVar16 = (ulong)uVar15;
    if (uVar16 < 0x29) {
      uVar15 = uVar15 + 8;
      plVar14 = (long *)((long)local_e8 + uVar16);
    }
    else {
      plVar14 = (long *)argp[0].overflow_arg_area;
      argp[0].overflow_arg_area = (void *)((long)argp[0].overflow_arg_area + 8);
    }
    lVar17 = *plVar14;
    pcVar20 = "%ld";
LAB_0010f69a:
    pcVar22 = tempbuf;
    uVar3 = snprintf(tempbuf,200,pcVar20,lVar17);
    iVar5 = -0x68;
    if (199 < uVar3) goto LAB_0010f6d2;
LAB_0010f6ad:
    sVar10 = strlen(pcVar22);
    iVar4 = membuffer_append(buf,pcVar22,sVar10);
    goto joined_r0x0010f3da;
  case 0x71:
    uVar16 = (ulong)uVar15;
    if (uVar16 < 0x29) {
      uVar18 = (ulong)*(uint *)((long)local_e8 + uVar16);
      uVar3 = uVar15 + 8;
      if (0x20 < uVar15) goto LAB_0010f11e;
      uVar3 = uVar15 + 0x10;
      puVar7 = (undefined8 *)((long)auStack_e0 + uVar16);
    }
    else {
      uVar18 = (ulong)*argp[0].overflow_arg_area;
      argp[0].overflow_arg_area = (void *)((long)argp[0].overflow_arg_area + 8);
      uVar3 = uVar15;
LAB_0010f11e:
      puVar7 = (undefined8 *)argp[0].overflow_arg_area;
      argp[0].overflow_arg_area = (void *)((long)argp[0].overflow_arg_area + 8);
    }
    if ((uri_type *)*puVar7 == (uri_type *)0x0) {
      __assert_fail("uri_ptr",".upnp/src/genlib/net/http/httpreadwrite.c",0x7ad,
                    "int http_MakeMessage(membuffer *, int, int, const char *, ...)");
    }
    iVar5 = http_FixUrl((uri_type *)*puVar7,&url);
    if (iVar5 != 0) {
      iVar5 = -0x6c;
      goto LAB_0010f6d2;
    }
    iVar5 = http_MakeMessage(buf,http_major_version,http_minor_version,"Qsbc",uVar18,
                             url.pathquery.buff,url.pathquery.size,"HOST: ",
                             CONCAT44(url.hostport.text.buff._4_4_,url.hostport.text.buff._0_4_),
                             CONCAT44(url.hostport.text.size._4_4_,
                                      (undefined4)url.hostport.text.size));
    uVar15 = uVar3;
    break;
  case 0x73:
    uVar16 = (ulong)uVar15;
    if (uVar16 < 0x29) {
      uVar15 = uVar15 + 8;
      plVar14 = (long *)((long)local_e8 + uVar16);
    }
    else {
      plVar14 = (long *)argp[0].overflow_arg_area;
      argp[0].overflow_arg_area = (void *)((long)argp[0].overflow_arg_area + 8);
    }
    pcVar20 = (char *)*plVar14;
    if (pcVar20 == (char *)0x0) {
      __assert_fail("s",".upnp/src/genlib/net/http/httpreadwrite.c",0x6be,
                    "int http_MakeMessage(membuffer *, int, int, const char *, ...)");
    }
    UpnpPrintf(UPNP_ALL,HTTP,".upnp/src/genlib/net/http/httpreadwrite.c",0x6c2,
               "Adding a string : %s\n",pcVar20);
LAB_0010f655:
    buf_len = strlen(pcVar20);
LAB_0010f666:
    iVar5 = membuffer_append(buf,pcVar20,buf_len);
    break;
  case 0x74:
    uVar16 = (ulong)uVar15;
    if (uVar16 < 0x29) {
      uVar15 = uVar15 + 8;
      plVar14 = (long *)((long)local_e8 + uVar16);
    }
    else {
      plVar14 = (long *)argp[0].overflow_arg_area;
      argp[0].overflow_arg_area = (void *)((long)argp[0].overflow_arg_area + 8);
    }
    __timer = (time_t *)*plVar14;
    pcVar20 = "";
    pcVar22 = "";
    if (__timer == (time_t *)0x0) {
      __assert_fail("loc_time",".upnp/src/genlib/net/http/httpreadwrite.c",0x716,
                    "int http_MakeMessage(membuffer *, int, int, const char *, ...)");
    }
LAB_0010f31b:
    ptVar9 = gmtime_r(__timer,(tm *)&date_storage);
    iVar5 = -0x68;
    if (ptVar9 == (tm *)0x0) goto LAB_0010f6d2;
    uVar3 = snprintf(tempbuf,200,"%s%s, %02d %s %d %02d:%02d:%02d GMT%s",pcVar22,
                     "Sun" + (long)ptVar9->tm_wday * 4,(ulong)(uint)ptVar9->tm_mday,
                     "Jan" + (long)ptVar9->tm_mon * 4,(ulong)(ptVar9->tm_year + 0x76c),
                     (ulong)(uint)ptVar9->tm_hour,(ulong)(uint)ptVar9->tm_min,
                     (ulong)(uint)ptVar9->tm_sec,pcVar20);
    if (199 < uVar3) goto LAB_0010f6d2;
    sVar10 = strlen(tempbuf);
    iVar4 = membuffer_append(buf,tempbuf,sVar10);
joined_r0x0010f3da:
    iVar5 = -0x68;
    if (iVar4 != 0) goto LAB_0010f6d2;
    goto LAB_0010ed34;
  }
  if (iVar5 != 0) {
    iVar5 = -0x68;
LAB_0010f6d2:
    membuffer_destroy(buf);
    return iVar5;
  }
  goto LAB_0010ed34;
switchD_0010ed50_caseD_4c:
  uVar16 = (ulong)uVar15;
  if (uVar16 < 0x29) {
    uVar15 = uVar15 + 8;
    plVar14 = (long *)((long)local_e8 + uVar16);
  }
  else {
    plVar14 = (long *)argp[0].overflow_arg_area;
    argp[0].overflow_arg_area = (void *)((long)argp[0].overflow_arg_area + 8);
  }
  if (*plVar14 == 0) {
    __assert_fail("RespInstr",".upnp/src/genlib/net/http/httpreadwrite.c",0x731,
                  "int http_MakeMessage(membuffer *, int, int, const char *, ...)");
  }
  goto LAB_0010ed34;
}

Assistant:

int http_MakeMessage(membuffer *buf,
	int http_major_version,
	int http_minor_version,
	const char *fmt,
	...)
{
	char c;
	char *s = NULL;
	size_t num;
	off_t bignum;
	size_t length;
	time_t *loc_time;
	time_t curr_time;
	struct tm date_storage;
	struct tm *date;
	const char *start_str;
	const char *end_str;
	int status_code;
	const char *status_msg;
	http_method_t method;
	const char *method_str;
	const char *url_str;
	const char *temp_str;
	uri_type url;
	uri_type *uri_ptr;
	int error_code = 0;
	va_list argp;
	char tempbuf[200];
	const char *weekday_str = "Sun\0Mon\0Tue\0Wed\0Thu\0Fri\0Sat";
	const char *month_str = "Jan\0Feb\0Mar\0Apr\0May\0Jun\0"
				"Jul\0Aug\0Sep\0Oct\0Nov\0Dec";
	int rc = 0;

	memset(tempbuf, 0, sizeof(tempbuf));
	va_start(argp, fmt);
	while ((c = *fmt++)) {
		if (c == 'E') {
			/* list of extra headers */
			UpnpListIter pos;
			UpnpListHead *head;
			UpnpExtraHeaders *extra;
			const DOMString resp;
			head = (UpnpListHead *)va_arg(argp, UpnpListHead *);
			if (head) {
				for (pos = UpnpListBegin(head);
					pos != UpnpListEnd(head);
					pos = UpnpListNext(head, pos)) {
					extra = (UpnpExtraHeaders *)pos;
					resp = UpnpExtraHeaders_get_resp(extra);
					if (resp) {
						if (membuffer_append(buf,
							    resp,
							    strlen(resp)))
							goto error_handler;
						if (membuffer_append(buf,
							    "\r\n",
							    (size_t)2))
							goto error_handler;
					}
				}
			}
		} else if (c == 's') {
			/* C string */
			s = (char *)va_arg(argp, char *);
			assert(s);
			UpnpPrintf(UPNP_ALL,
				HTTP,
				__FILE__,
				__LINE__,
				"Adding a string : %s\n",
				s);
			if (membuffer_append(buf, s, strlen(s)))
				goto error_handler;
		} else if (c == 'K') {
			/* Add Chunky header */
			if (membuffer_append_str(
				    buf, "TRANSFER-ENCODING: chunked\r\n"))
				goto error_handler;
		} else if (c == 'A') {
			/* Add Access-Control-Allow-Origin header only if
			 * set by UpnpSetWebServerCorsString */
			struct SendInstruction *RespInstr;
			RespInstr = (struct SendInstruction *)va_arg(
				argp, struct SendInstruction *);
			assert(RespInstr);
			if (RespInstr->CorsHeader &&
				strcmp(RespInstr->CorsHeader, "") &&
				http_MakeMessage(buf,
					http_major_version,
					http_minor_version,
					"ssc",
					"Access-Control-Allow-Origin: ",
					RespInstr->CorsHeader) != 0)
				goto error_handler;
		} else if (c == 'G') {
			/* Add Range header */
			struct SendInstruction *RespInstr;
			RespInstr = (struct SendInstruction *)va_arg(
				argp, struct SendInstruction *);
			assert(RespInstr);
			/* connection header */
			if (membuffer_append(buf,
				    RespInstr->RangeHeader,
				    strlen(RespInstr->RangeHeader)))
				goto error_handler;
		} else if (c == 'b') {
			/* mem buffer */
			s = (char *)va_arg(argp, char *);
			UpnpPrintf(UPNP_ALL,
				HTTP,
				__FILE__,
				__LINE__,
				"Adding a char Buffer starting with: %c\n",
				(int)s[0]);
			assert(s);
			length = (size_t)va_arg(argp, size_t);
			if (membuffer_append(buf, s, length))
				goto error_handler;
		} else if (c == 'c') {
			/* crlf */
			if (membuffer_append(buf, "\r\n", (size_t)2))
				goto error_handler;
		} else if (c == 'd') {
			/* integer */
			num = (size_t)va_arg(argp, int);
			rc = snprintf(tempbuf, sizeof(tempbuf), "%" PRIzu, num);
			if (rc < 0 || (unsigned int)rc >= sizeof(tempbuf) ||
				membuffer_append(buf, tempbuf, strlen(tempbuf)))
				goto error_handler;
		} else if (c == 'h') {
			/* off_t */
			bignum = (off_t)va_arg(argp, off_t);
			rc = snprintf(tempbuf,
				sizeof(tempbuf),
				"%" PRId64,
				(int64_t)bignum);
			if (rc < 0 || (unsigned int)rc >= sizeof(tempbuf) ||
				membuffer_append(buf, tempbuf, strlen(tempbuf)))
				goto error_handler;
		} else if (c == 't' || c == 'D') {
			/* date */
			if (c == 'D') {
				/* header */
				start_str = "DATE: ";
				end_str = "\r\n";
				curr_time = time(NULL);
				loc_time = &curr_time;
			} else {
				/* date value only */
				start_str = end_str = "";
				loc_time = (time_t *)va_arg(argp, time_t *);
			}
			assert(loc_time);
			date = http_gmtime_r(loc_time, &date_storage);
			if (date == NULL)
				goto error_handler;
			rc = snprintf(tempbuf,
				sizeof(tempbuf),
				"%s%s, %02d %s %d %02d:%02d:%02d GMT%s",
				start_str,
				&weekday_str[date->tm_wday * 4],
				date->tm_mday,
				&month_str[date->tm_mon * 4],
				date->tm_year + 1900,
				date->tm_hour,
				date->tm_min,
				date->tm_sec,
				end_str);
			if (rc < 0 || (unsigned int)rc >= sizeof(tempbuf) ||
				membuffer_append(buf, tempbuf, strlen(tempbuf)))
				goto error_handler;
		} else if (c == 'L') {
			/* Add CONTENT-LANGUAGE header only if
			 * WEB_SERVER_CONTENT_LANGUAGE */
			/* is not empty and if Accept-Language header is not
			 * empty */
			struct SendInstruction *RespInstr;
			RespInstr = (struct SendInstruction *)va_arg(
				argp, struct SendInstruction *);
			assert(RespInstr);
			if (strcmp(RespInstr->AcceptLanguageHeader, "") &&
				strcmp(WEB_SERVER_CONTENT_LANGUAGE, "") &&
				http_MakeMessage(buf,
					http_major_version,
					http_minor_version,
					"ssc",
					"CONTENT-LANGUAGE: ",
					WEB_SERVER_CONTENT_LANGUAGE) != 0)
				goto error_handler;
		} else if (c == 'C') {
			if ((http_major_version > 1) ||
				(http_major_version == 1 &&
					http_minor_version == 1)) {
				/* connection header */
				if (membuffer_append_str(
					    buf, "CONNECTION: close\r\n"))
					goto error_handler;
			}
		} else if (c == 'N') {
			/* content-length header */
			bignum = (off_t)va_arg(argp, off_t);
			assert(bignum >= 0);
			if (http_MakeMessage(buf,
				    http_major_version,
				    http_minor_version,
				    "shc",
				    "CONTENT-LENGTH: ",
				    bignum) != 0)
				goto error_handler;
			/* Add accept ranges */
			if (http_MakeMessage(buf,
				    http_major_version,
				    http_minor_version,
				    "sc",
				    "Accept-Ranges: bytes") != 0)
				goto error_handler;
		} else if (c == 'S' || c == 'U') {
			/* SERVER or USER-AGENT header */
			temp_str = (c == 'S') ? "SERVER: " : "USER-AGENT: ";
			get_sdk_info(tempbuf, sizeof(tempbuf));
			if (http_MakeMessage(buf,
				    http_major_version,
				    http_minor_version,
				    "ss",
				    temp_str,
				    tempbuf) != 0)
				goto error_handler;
		} else if (c == 'X') {
			/* C string */
			s = (char *)va_arg(argp, char *);
			assert(s);
			if (membuffer_append_str(buf, "X-User-Agent: ") != 0)
				goto error_handler;
			if (membuffer_append(buf, s, strlen(s)) != 0)
				goto error_handler;
		} else if (c == 'R') {
			/* response start line */
			/*   e.g.: 'HTTP/1.1 200 OK' code */
			status_code = (int)va_arg(argp, int);
			assert(status_code > 0);
			rc = snprintf(tempbuf,
				sizeof(tempbuf),
				"HTTP/%d.%d %d ",
				http_major_version,
				http_minor_version,
				status_code);
			/* str */
			status_msg = http_get_code_text(status_code);
			if (rc < 0 || (unsigned int)rc >= sizeof(tempbuf) ||
				http_MakeMessage(buf,
					http_major_version,
					http_minor_version,
					"ssc",
					tempbuf,
					status_msg) != 0)
				goto error_handler;
		} else if (c == 'B') {
			/* body of a simple reply */
			status_code = (int)va_arg(argp, int);
			rc = snprintf(tempbuf,
				sizeof(tempbuf),
				"%s%d %s%s",
				"<html><body><h1>",
				status_code,
				http_get_code_text(status_code),
				"</h1></body></html>");
			if (rc < 0 || (unsigned int)rc >= sizeof(tempbuf))
				goto error_handler;
			bignum = (off_t)strlen(tempbuf);
			if (http_MakeMessage(buf,
				    http_major_version,
				    http_minor_version,
				    "NTcs",
				    bignum,	  /* content-length */
				    "text/html",  /* content-type */
				    tempbuf) != 0 /* body */
			)
				goto error_handler;
		} else if (c == 'Q') {
			/* request start line */
			/* GET /foo/bar.html HTTP/1.1\r\n */
			method = (http_method_t)va_arg(argp, http_method_t);
			method_str = method_to_str(method);
			url_str = (const char *)va_arg(argp, const char *);
			num = (size_t)va_arg(
				argp, size_t); /* length of url_str */
			if (http_MakeMessage(buf,
				    http_major_version,
				    http_minor_version,
				    "ssbsdsdc",
				    method_str, /* method */
				    " ",
				    url_str,
				    num, /* url */
				    " HTTP/",
				    http_major_version,
				    ".",
				    http_minor_version) != 0)
				goto error_handler;
		} else if (c == 'q') {
			/* request start line and HOST header */
			method = (http_method_t)va_arg(argp, http_method_t);
			uri_ptr = (uri_type *)va_arg(argp, uri_type *);
			assert(uri_ptr);
			if (http_FixUrl(uri_ptr, &url) != 0) {
				error_code = UPNP_E_INVALID_URL;
				goto error_handler;
			}
			if (http_MakeMessage(buf,
				    http_major_version,
				    http_minor_version,
				    "Q"
				    "sbc",
				    method,
				    url.pathquery.buff,
				    url.pathquery.size,
				    "HOST: ",
				    url.hostport.text.buff,
				    url.hostport.text.size) != 0)
				goto error_handler;
		} else if (c == 'T') {
			/* content type header */
			temp_str = (const char *)va_arg(
				argp, const char *); /* type/subtype format */
			if (http_MakeMessage(buf,
				    http_major_version,
				    http_minor_version,
				    "ssc",
				    "CONTENT-TYPE: ",
				    temp_str) != 0)
				goto error_handler;
		} else {
			assert(0);
		}
	}
	goto ExitFunction;

error_handler:
	/* Default is out of memory error. */
	if (!error_code)
		error_code = UPNP_E_OUTOF_MEMORY;
	membuffer_destroy(buf);

ExitFunction:
	va_end(argp);
	return error_code;
}